

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O3

parser_node * amrex::parser_ast_dup(amrex_parser *my_parser,parser_node *node,int move)

{
  parser_node_t __val;
  parser_nvp pVar1;
  uint uVar2;
  size_t sVar3;
  parser_node *ppVar4;
  long *plVar5;
  uint uVar6;
  size_type *psVar7;
  ulong uVar8;
  parser_node *ppVar9;
  uint __len;
  parser_node_t pVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  pVar10 = node->type;
  switch(pVar10) {
  case PARSER_NUMBER:
    ppVar9 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar9->r;
    uVar11 = *(undefined4 *)&node->field_0x4;
    ppVar4 = node->l;
    ppVar9->type = node->type;
    *(undefined4 *)&ppVar9->field_0x4 = uVar11;
    ppVar9->l = ppVar4;
    break;
  case PARSER_SYMBOL:
    ppVar9 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar9->rip;
    ppVar9->r = node->r;
    uVar11 = *(undefined4 *)&node->field_0x4;
    ppVar4 = node->l;
    ppVar9->type = node->type;
    *(undefined4 *)&ppVar9->field_0x4 = uVar11;
    ppVar9->l = ppVar4;
    sVar3 = strlen((char *)node->l);
    ppVar4 = (parser_node *)my_parser->p_free;
    my_parser->p_free = (void *)((long)&ppVar4->r + (sVar3 & 0xfffffffffffffff0));
    ppVar9->l = ppVar4;
    strcpy((char *)ppVar4,(char *)node->l);
    break;
  case PARSER_ADD:
  case PARSER_SUB:
  case PARSER_MUL:
  case PARSER_DIV:
  case PARSER_LIST:
  case PARSER_ADD_PP:
  case PARSER_SUB_PP:
  case PARSER_MUL_PP:
  case PARSER_DIV_PP:
    ppVar9 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar9[1].l;
    uVar11 = *(undefined4 *)&node->field_0x24;
    ppVar9->rip = node->rip;
    *(undefined4 *)&ppVar9->field_0x24 = uVar11;
    goto LAB_00722333;
  case PARSER_NEG:
    ppVar9 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar9[1].l;
    uVar11 = *(undefined4 *)&node->field_0x24;
    ppVar9->rip = node->rip;
    *(undefined4 *)&ppVar9->field_0x24 = uVar11;
    pVar10 = node->type;
    uVar11 = *(undefined4 *)&node->field_0x4;
    ppVar4 = node->l;
    pVar1 = node->lvp;
    ppVar9->r = node->r;
    ppVar9->lvp = pVar1;
    ppVar9->type = pVar10;
    *(undefined4 *)&ppVar9->field_0x4 = uVar11;
    ppVar9->l = ppVar4;
    ppVar4 = parser_ast_dup(my_parser,node->l,move);
    ppVar9->l = ppVar4;
    ppVar9->r = (parser_node *)0x0;
    break;
  case PARSER_F1:
    ppVar9 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar9->rip;
    ppVar9->r = node->r;
    pVar10 = node->type;
    uVar11 = *(undefined4 *)&node->field_0x4;
    uVar12 = *(undefined4 *)&node->l;
    uVar13 = *(undefined4 *)((long)&node->l + 4);
    goto LAB_007224c3;
  case PARSER_F2:
    ppVar9 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar9->rip;
LAB_00722333:
    pVar10 = node->type;
    uVar11 = *(undefined4 *)&node->field_0x4;
    uVar12 = *(undefined4 *)&node->l;
    uVar13 = *(undefined4 *)((long)&node->l + 4);
    pVar1 = node->lvp;
    ppVar9->r = node->r;
    ppVar9->lvp = pVar1;
LAB_0072233f:
    ppVar9->type = pVar10;
    *(undefined4 *)&ppVar9->field_0x4 = uVar11;
    *(undefined4 *)&ppVar9->l = uVar12;
    *(undefined4 *)((long)&ppVar9->l + 4) = uVar13;
    ppVar4 = parser_ast_dup(my_parser,node->l,move);
    ppVar9->l = ppVar4;
LAB_0072237b:
    ppVar4 = parser_ast_dup(my_parser,node->r,move);
    ppVar9->r = ppVar4;
    break;
  case PARSER_F3:
    ppVar9 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar9[1].l;
    uVar11 = *(undefined4 *)&node->field_0x24;
    ppVar9->rip = node->rip;
    *(undefined4 *)&ppVar9->field_0x24 = uVar11;
    pVar10 = node->type;
    uVar11 = *(undefined4 *)&node->field_0x4;
    ppVar4 = node->l;
    pVar1 = node->lvp;
    ppVar9->r = node->r;
    ppVar9->lvp = pVar1;
    ppVar9->type = pVar10;
    *(undefined4 *)&ppVar9->field_0x4 = uVar11;
    ppVar9->l = ppVar4;
    ppVar4 = parser_ast_dup(my_parser,node->l,move);
    ppVar9->l = ppVar4;
    ppVar4 = parser_ast_dup(my_parser,node->r,move);
    ppVar9->r = ppVar4;
    ppVar4 = parser_ast_dup(my_parser,(node->lvp).n,move);
    (ppVar9->lvp).n = ppVar4;
    break;
  case PARSER_ASSIGN:
    ppVar9 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar9->rip;
    ppVar9->r = node->r;
    pVar10 = node->type;
    uVar11 = *(undefined4 *)&node->field_0x4;
    uVar12 = *(undefined4 *)&node->l;
    uVar13 = *(undefined4 *)((long)&node->l + 4);
    goto LAB_0072233f;
  case PARSER_ADD_VP:
  case PARSER_SUB_VP:
  case PARSER_MUL_VP:
  case PARSER_DIV_VP:
    ppVar9 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar9[1].l;
    uVar11 = *(undefined4 *)&node->field_0x24;
    ppVar9->rip = node->rip;
    *(undefined4 *)&ppVar9->field_0x24 = uVar11;
    pVar10 = node->type;
    uVar11 = *(undefined4 *)&node->field_0x4;
    ppVar4 = node->l;
    pVar1 = node->lvp;
    ppVar9->r = node->r;
    ppVar9->lvp = pVar1;
    ppVar9->type = pVar10;
    *(undefined4 *)&ppVar9->field_0x4 = uVar11;
    ppVar9->l = ppVar4;
    goto LAB_0072237b;
  case PARSER_NEG_P:
    ppVar9 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar9[1].l;
    uVar11 = *(undefined4 *)&node->field_0x24;
    ppVar9->rip = node->rip;
    *(undefined4 *)&ppVar9->field_0x24 = uVar11;
    pVar10 = node->type;
    uVar11 = *(undefined4 *)&node->field_0x4;
    uVar12 = *(undefined4 *)&node->l;
    uVar13 = *(undefined4 *)((long)&node->l + 4);
    pVar1 = node->lvp;
    ppVar9->r = node->r;
    ppVar9->lvp = pVar1;
LAB_007224c3:
    ppVar9->type = pVar10;
    *(undefined4 *)&ppVar9->field_0x4 = uVar11;
    *(undefined4 *)&ppVar9->l = uVar12;
    *(undefined4 *)((long)&ppVar9->l + 4) = uVar13;
    ppVar4 = parser_ast_dup(my_parser,node->l,move);
    ppVar9->l = ppVar4;
    break;
  default:
    __val = -pVar10;
    if (0 < (int)pVar10) {
      __val = pVar10;
    }
    __len = 1;
    if (PARSER_F2 < __val) {
      uVar8 = (ulong)__val;
      uVar2 = 4;
      do {
        __len = uVar2;
        uVar6 = (uint)uVar8;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_007225ad;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_007225ad;
        }
        if (uVar6 < 10000) goto LAB_007225ad;
        uVar8 = uVar8 / 10000;
        uVar2 = __len + 4;
      } while (99999 < uVar6);
      __len = __len + 1;
    }
LAB_007225ad:
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - (char)((int)pVar10 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_70[0] + (ulong)(pVar10 >> 0x1f)),__len,__val);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x779bdb);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_50.field_2._M_allocated_capacity = *psVar7;
      local_50.field_2._8_8_ = plVar5[3];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar7;
      local_50._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_50._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Abort(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    ppVar9 = (parser_node *)0x0;
  }
  if (move != 0) {
    if (node->type == PARSER_SYMBOL) {
      free(node->l);
    }
    free(node);
  }
  return ppVar9;
}

Assistant:

struct parser_node*
parser_ast_dup (struct amrex_parser* my_parser, struct parser_node* node, int move)
{
    void* result = nullptr;

    switch (node->type)
    {
    case PARSER_NUMBER:
        result = parser_allocate(my_parser, sizeof(struct parser_number));
        std::memcpy(result, node          , sizeof(struct parser_number));
        break;
    case PARSER_SYMBOL:
        result = parser_allocate(my_parser, sizeof(struct parser_symbol));
        std::memcpy(result, node          , sizeof(struct parser_symbol));
        ((struct parser_symbol*)result)->name = (char*) parser_allocate
            (my_parser, std::strlen(((struct parser_symbol*)node)->name)+1);
        std::strcpy(((struct parser_symbol*)result)->name,
                    ((struct parser_symbol*)node  )->name);
        break;
    case PARSER_ADD:
    case PARSER_SUB:
    case PARSER_MUL:
    case PARSER_DIV:
    case PARSER_ADD_PP:
    case PARSER_SUB_PP:
    case PARSER_MUL_PP:
    case PARSER_DIV_PP:
    case PARSER_LIST:
        result = parser_allocate(my_parser, sizeof(struct parser_node));
        std::memcpy(result, node          , sizeof(struct parser_node));
        ((struct parser_node*)result)->l = parser_ast_dup(my_parser, node->l, move);
        ((struct parser_node*)result)->r = parser_ast_dup(my_parser, node->r, move);
        break;
    case PARSER_NEG:
        result = parser_allocate(my_parser, sizeof(struct parser_node));
        std::memcpy(result, node          , sizeof(struct parser_node));
        ((struct parser_node*)result)->l = parser_ast_dup(my_parser, node->l, move);
        ((struct parser_node*)result)->r = nullptr;
        break;
    case PARSER_F1:
        result = parser_allocate(my_parser, sizeof(struct parser_f1));
        std::memcpy(result, node          , sizeof(struct parser_f1));
        ((struct parser_f1*)result)->l = parser_ast_dup(my_parser,
                                                 ((struct parser_f1*)node)->l, move);
        break;
    case PARSER_F2:
        result = parser_allocate(my_parser, sizeof(struct parser_f2));
        std::memcpy(result, node          , sizeof(struct parser_f2));
        ((struct parser_f2*)result)->l = parser_ast_dup(my_parser,
                                                 ((struct parser_f2*)node)->l, move);
        ((struct parser_f2*)result)->r = parser_ast_dup(my_parser,
                                                 ((struct parser_f2*)node)->r, move);
        break;
    case PARSER_F3:
        result = parser_allocate(my_parser, sizeof(struct parser_f3));
        std::memcpy(result, node          , sizeof(struct parser_f3));
        ((struct parser_f3*)result)->n1 = parser_ast_dup(my_parser,
                                                 ((struct parser_f3*)node)->n1, move);
        ((struct parser_f3*)result)->n2 = parser_ast_dup(my_parser,
                                                 ((struct parser_f3*)node)->n2, move);
        ((struct parser_f3*)result)->n3 = parser_ast_dup(my_parser,
                                                 ((struct parser_f3*)node)->n3, move);
        break;
    case PARSER_ASSIGN:
        result = parser_allocate(my_parser, sizeof(struct parser_assign));
        std::memcpy(result, node          , sizeof(struct parser_assign));
        ((struct parser_assign*)result)->s = (struct parser_symbol*)
            parser_ast_dup(my_parser, (struct parser_node*)
                                                (((struct parser_assign*)node)->s), move);
        ((struct parser_assign*)result)->v = parser_ast_dup(my_parser,
                                                 ((struct parser_assign*)node)->v, move);
        break;
    case PARSER_ADD_VP:
    case PARSER_SUB_VP:
    case PARSER_MUL_VP:
    case PARSER_DIV_VP:
        result = parser_allocate(my_parser, sizeof(struct parser_node));
        std::memcpy(result, node          , sizeof(struct parser_node));
        ((struct parser_node*)result)->r = parser_ast_dup(my_parser, node->r, move);
        break;
    case PARSER_NEG_P:
        result = parser_allocate(my_parser, sizeof(struct parser_node));
        std::memcpy(result, node          , sizeof(struct parser_node));
        ((struct parser_node*)result)->l = parser_ast_dup(my_parser, node->l, move);
        break;
    default:
        amrex::Abort("parser_ast_dup: unknown node type " + std::to_string(node->type));
    }
    if (move) {
        /* Note that we only do this on the original AST.  We do not
         * need to call free for AST stored in amrex_parser because the
         * memory is not allocated with std::malloc directly.
         */
        if (node->type == PARSER_SYMBOL) {
            std::free(((struct parser_symbol*)node)->name);
        }
        std::free((void*)node);
    }
    return (struct parser_node*)result;
}